

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O0

Amount cfd::core::operator*(int64_t value,Amount *amount)

{
  int64_t satoshi_amount;
  Amount AVar1;
  Amount local_38;
  Amount *local_28;
  Amount *amount_local;
  int64_t value_local;
  
  local_28 = amount;
  amount_local = (Amount *)value;
  satoshi_amount = Amount::GetSatoshiValue(amount);
  AVar1 = Amount::CreateBySatoshiAmount(satoshi_amount);
  local_38.amount_ = AVar1.amount_;
  local_38.ignore_check_ = AVar1.ignore_check_;
  AVar1 = Amount::operator*=(&local_38,value);
  return AVar1;
}

Assistant:

Amount operator*(const int64_t value, const Amount& amount) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) *= value;
}